

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>const&,int>
::load_impl_sequence<0ul,1ul>
          (argument_loader<anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>const&,int>
           *this,long call)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 8),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  bVar2 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                     SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
  return bVar2 && bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }